

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountDownLatch.cpp
# Opt level: O2

void __thiscall sznet::CountDownLatch::CountDownLatch(CountDownLatch *this,int count)

{
  MutexLock::MutexLock(&this->m_mutex);
  (this->m_condition).m_mutex = &this->m_mutex;
  sz_cond_init(&(this->m_condition).m_cond);
  this->m_count = count;
  return;
}

Assistant:

CountDownLatch::CountDownLatch(int count) :
	m_mutex(),
	m_condition(m_mutex),
	m_count(count)
{
}